

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFontConfig::ImFontConfig(ImFontConfig *this)

{
  memset(this,0,0x88);
  this->FontDataOwnedByAtlas = true;
  this->OversampleH = 3;
  this->OversampleV = 1;
  this->GlyphMaxAdvanceX = 3.4028235e+38;
  this->RasterizerMultiply = 1.0;
  this->EllipsisChar = 0xffff;
  return;
}

Assistant:

ImFontConfig::ImFontConfig()
{
    memset(this, 0, sizeof(*this));
    FontDataOwnedByAtlas = true;
    OversampleH = 3; // FIXME: 2 may be a better default?
    OversampleV = 1;
    GlyphMaxAdvanceX = FLT_MAX;
    RasterizerMultiply = 1.0f;
    EllipsisChar = (ImWchar)-1;
}